

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubwordLearner.cc
# Opt level: O2

void __thiscall onmt::SubwordLearner::ingest(SubwordLearner *this,string *text,Tokenizer *tokenizer)

{
  pointer pTVar1;
  vector<onmt::Token,_std::allocator<onmt::Token>_> *__range1;
  Token *token;
  pointer pTVar2;
  vector<onmt::Token,_std::allocator<onmt::Token>_> tokens;
  
  if (tokenizer == (Tokenizer *)0x0) {
    tokenizer = (this->_default_tokenizer).
                super___shared_ptr<const_onmt::Tokenizer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  tokens.super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tokens.super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  tokens.super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Tokenizer::tokenize(tokenizer,text,&tokens,true);
  pTVar1 = tokens.super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pTVar2 = tokens.super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>._M_impl.
                super__Vector_impl_data._M_start; pTVar2 != pTVar1; pTVar2 = pTVar2 + 1) {
    (*this->_vptr_SubwordLearner[2])(this,pTVar2);
  }
  std::vector<onmt::Token,_std::allocator<onmt::Token>_>::~vector(&tokens);
  return;
}

Assistant:

void SubwordLearner::ingest(const std::string& text, const Tokenizer* tokenizer)
  {
    if (!tokenizer)
      tokenizer = _default_tokenizer.get();

    std::vector<Token> tokens;
    tokenizer->tokenize(text, tokens);
    for (const auto& token : tokens)
      ingest_token(token);
  }